

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventFilter.hpp
# Opt level: O2

size_t __thiscall
binlog::EventFilter::writeAllowed<TestStream>
          (EventFilter *this,char *buffer,size_t bufferSize,TestStream *out)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  char *pcVar4;
  TestStream *__n;
  size_t sVar5;
  ulong size;
  uint64_t tag;
  Range payload;
  Range entries;
  EventSource eventSource;
  Range entry;
  unsigned_long local_128;
  Range local_120;
  Range local_110;
  EventSource local_100;
  Range local_48;
  
  local_110._end = buffer + bufferSize;
  sVar5 = 0;
  __n = out;
  local_110._begin = buffer;
LAB_00180f17:
  if (local_110._begin == local_110._end) {
    return sVar5;
  }
  local_48._begin = local_110._begin;
  local_48._end = local_110._end;
  uVar2 = Range::read<unsigned_int>(&local_110);
  size = (ulong)uVar2;
  local_120._begin = Range::view(&local_110,size);
  local_120._end = local_120._begin + size;
  local_128 = Range::read<unsigned_long>(&local_120);
  if (-1 < (long)local_128) goto code_r0x00180f64;
  if (local_128 == 0xffffffffffffffff) {
    local_100.id = 0;
    local_100.severity = info;
    local_100.category._M_dataplus._M_p = (pointer)&local_100.category.field_2;
    local_100.category._M_string_length = 0;
    __n = (TestStream *)0x0;
    local_100.category.field_2._M_local_buf[0] = '\0';
    local_100.function._M_dataplus._M_p = (pointer)&local_100.function.field_2;
    local_100.function._M_string_length = 0;
    local_100.function.field_2._M_local_buf[0] = '\0';
    local_100.file._M_dataplus._M_p = (pointer)&local_100.file.field_2;
    local_100.file._M_string_length = 0;
    local_100.file.field_2._M_local_buf[0] = '\0';
    local_100.line = 0;
    local_100.formatString._M_dataplus._M_p = (pointer)&local_100.formatString.field_2;
    local_100.formatString._M_string_length = 0;
    local_100.formatString.field_2._M_local_buf[0] = '\0';
    local_100.argumentTags._M_dataplus._M_p = (pointer)&local_100.argumentTags.field_2;
    local_100.argumentTags._M_string_length = 0;
    local_100.argumentTags.field_2._M_local_buf[0] = '\0';
    mserialize::
    StructDeserializer<binlog::EventSource,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::id>,_std::integral_constant<binlog::Severity_binlog::EventSource::*,_&binlog::EventSource::severity>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::category>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::function>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::file>,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::line>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::formatString>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::argumentTags>_>
    ::deserialize<binlog::Range>(&local_100,&local_120);
    bVar1 = std::function<bool_(const_binlog::EventSource_&)>::operator()
                      (&this->_isAllowed,&local_100);
    if (bVar1) {
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&this->_allowedSourceIds,&local_100.id);
    }
    EventSource::~EventSource(&local_100);
  }
  goto LAB_0018105c;
code_r0x00180f64:
  sVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::count
                    (&this->_allowedSourceIds,&local_128);
  if (sVar3 != 0) {
LAB_0018105c:
    pcVar4 = Range::view(&local_48,(size_t)(size + 4));
    TestStream::write(out,(int)pcVar4,(void *)(size + 4),(size_t)__n);
    sVar5 = sVar5 + size + 4;
  }
  goto LAB_00180f17;
}

Assistant:

std::size_t EventFilter::writeAllowed(const char* buffer, std::size_t bufferSize, OutputStream& out)
{
  std::size_t totalWriteSize = 0;

  Range entries(buffer, bufferSize);

  while (! entries.empty())
  {
    Range entry = entries;
    const std::uint32_t size = entries.read<std::uint32_t>();
    Range payload(entries.view(size), size);
    const std::uint64_t tag = payload.read<std::uint64_t>();
    const bool special = (tag & (std::uint64_t(1) << 63)) != 0;

    if (special)
    {
      // event sources are inspected to populate _allowedSourceIds
      if (tag == EventSource::Tag)
      {
        EventSource eventSource;
        mserialize::deserialize(eventSource, payload);
        if (_isAllowed(eventSource))
        {
          _allowedSourceIds.insert(eventSource.id);
        }
        // else: event source is not allowed, events referencing it
        // will not be written.
      }
    }
    else if (_allowedSourceIds.count(tag) == 0)
    {
      // event is produced by a disallowed source, ignore it
      continue;
    }

    // either special entry or event produced by an allowed source, write it
    // TODO(benedek) perf: batch contiguous entries into one out.write
    const std::size_t sizePrefixedSize = size + sizeof(size);
    out.write(entry.view(sizePrefixedSize), std::streamsize(sizePrefixedSize));
    totalWriteSize += sizePrefixedSize;
  }

  return totalWriteSize;
}